

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(chronometer)>
nonius::detail::measure_one<std::chrono::_V2::system_clock,nonius::detail::benchmark_function&>
          (undefined8 *fun,uint iters)

{
  chronometer_model<std::chrono::_V2::system_clock> meter;
  
  (**(code **)(*(long *)*fun + 8))();
  return (TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(chronometer)>
          )(ZEXT416(iters) << 0x60);
}

Assistant:

TimingOf<Clock, Fun(chronometer)> measure_one(Fun&& fun, int iters, const parameters& params, std::true_type) {
            detail::chronometer_model<Clock> meter;
            auto&& result = detail::complete_invoke(fun, chronometer(meter, iters, params));

            return { meter.elapsed(), std::move(result), iters };
        }